

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O1

void __thiscall binlog::EventStream::readEventSource(EventStream *this,Range range)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  EventSource eventSource;
  EventSource local_f8;
  Range local_40;
  
  local_40._end = range._end;
  local_40._begin = range._begin;
  paVar1 = &local_f8.category.field_2;
  local_f8.id = 0;
  local_f8.severity = info;
  local_f8.category._M_string_length = 0;
  local_f8.category.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_f8.function.field_2;
  local_f8.function._M_string_length = 0;
  local_f8.function.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_f8.file.field_2;
  local_f8.file._M_string_length = 0;
  local_f8.file.field_2._M_local_buf[0] = '\0';
  local_f8.line = 0;
  paVar4 = &local_f8.formatString.field_2;
  local_f8.formatString._M_string_length = 0;
  local_f8.formatString.field_2._M_local_buf[0] = '\0';
  paVar5 = &local_f8.argumentTags.field_2;
  local_f8.argumentTags._M_string_length = 0;
  local_f8.argumentTags.field_2._M_local_buf[0] = '\0';
  local_f8.category._M_dataplus._M_p = (pointer)paVar1;
  local_f8.function._M_dataplus._M_p = (pointer)paVar2;
  local_f8.file._M_dataplus._M_p = (pointer)paVar3;
  local_f8.formatString._M_dataplus._M_p = (pointer)paVar4;
  local_f8.argumentTags._M_dataplus._M_p = (pointer)paVar5;
  mserialize::
  StructDeserializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
  ::deserialize<binlog::Range>(&local_f8,&local_40);
  detail::SegmentedMap<binlog::EventSource>::emplace<binlog::EventSource>
            (&this->_eventSources,local_f8.id,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.argumentTags._M_dataplus._M_p != paVar5) {
    operator_delete(local_f8.argumentTags._M_dataplus._M_p,
                    CONCAT71(local_f8.argumentTags.field_2._M_allocated_capacity._1_7_,
                             local_f8.argumentTags.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.formatString._M_dataplus._M_p != paVar4) {
    operator_delete(local_f8.formatString._M_dataplus._M_p,
                    CONCAT71(local_f8.formatString.field_2._M_allocated_capacity._1_7_,
                             local_f8.formatString.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.file._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8.file._M_dataplus._M_p,
                    CONCAT71(local_f8.file.field_2._M_allocated_capacity._1_7_,
                             local_f8.file.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.function._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8.function._M_dataplus._M_p,
                    CONCAT71(local_f8.function.field_2._M_allocated_capacity._1_7_,
                             local_f8.function.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.category._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8.category._M_dataplus._M_p,
                    CONCAT71(local_f8.category.field_2._M_allocated_capacity._1_7_,
                             local_f8.category.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EventStream::readEventSource(Range range)
{
  EventSource eventSource;
  mserialize::deserialize(eventSource, range);
  _eventSources.emplace(eventSource.id, std::move(eventSource));
}